

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::AddErrorInstanceLocation
          (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
           *this,ValueType *result,bool parent)

{
  char *pcVar1;
  char *pcVar2;
  Ch *s;
  CrtAllocator *pCVar3;
  StringRefType *pSVar4;
  ValueType instanceRef;
  PointerType instancePointer;
  Data local_e8;
  undefined8 local_d8;
  Token *local_d0;
  long local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  Stack<rapidjson::CrtAllocator> local_a8;
  StringRefType local_78;
  PointerType local_68;
  
  local_a8.stack_ = (char *)0x0;
  local_a8.stackTop_ = (char *)0x0;
  local_a8.allocator_ = (CrtAllocator *)0x0;
  local_a8.ownAllocator_ = (CrtAllocator *)0x0;
  local_a8.stackEnd_ = (char *)0x0;
  local_a8.initialCapacity_ = 0x100;
  GetInvalidDocumentPointer(&local_68,this);
  if ((parent) && (local_68.tokenCount_ != 0)) {
    local_c8 = local_68.tokenCount_ - 1;
    local_e8.n.i64 = (Number)0x0;
    local_e8.s.str = (Ch *)0x0;
    local_d8 = 0;
    local_d0 = local_68.tokens_;
    local_c0 = 0;
    local_b8 = 0;
  }
  else {
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::GenericPointer((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                      *)&local_e8.s,&local_68);
  }
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
  ::Stringify<true,rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>>
            ((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
              *)&local_e8.s,
             (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_a8);
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  ::~GenericPointer((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                     *)&local_e8.s);
  s = GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_a8);
  pcVar2 = local_a8.stackTop_;
  pcVar1 = local_a8.stack_;
  pCVar3 = GetStateAllocator(this);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericValue
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_e8.s,s,
             (int)pcVar2 - (int)pcVar1,pCVar3);
  pSVar4 = GetInstanceRefString();
  local_78.s = pSVar4->s;
  local_78.length = pSVar4->length;
  pCVar3 = GetStateAllocator(this);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
            (result,&local_78,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_e8.s,pCVar3);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_e8.s);
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  ::~GenericPointer(&local_68);
  internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_a8);
  return;
}

Assistant:

void AddErrorInstanceLocation(ValueType& result, bool parent) {
        GenericStringBuffer<EncodingType> sb;
        PointerType instancePointer = GetInvalidDocumentPointer();
        ((parent && instancePointer.GetTokenCount() > 0)
         ? PointerType(instancePointer.GetTokens(), instancePointer.GetTokenCount() - 1)
         : instancePointer).StringifyUriFragment(sb);
        ValueType instanceRef(sb.GetString(), static_cast<SizeType>(sb.GetSize() / sizeof(Ch)),
                              GetStateAllocator());
        result.AddMember(GetInstanceRefString(), instanceRef, GetStateAllocator());
    }